

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecp_id_tc26_gost_3410_2012_512_paramSetA.c
# Opt level: O0

int point_mul_two_id_tc26_gost_3410_2012_512_paramSetA
              (EC_GROUP *group,EC_POINT *r,BIGNUM *n,EC_POINT *q,BIGNUM *m,BN_CTX *ctx)

{
  int iVar1;
  BIGNUM *pBVar2;
  BIGNUM *pBVar3;
  long lVar4;
  undefined8 in_RCX;
  undefined8 in_RDX;
  EC_POINT *in_RSI;
  EC_GROUP *in_RDI;
  undefined8 in_R8;
  BN_CTX *in_R9;
  BIGNUM *y;
  BIGNUM *x;
  uchar b_m [64];
  uchar b_n [64];
  uchar b_y [64];
  uchar b_x [64];
  int ret;
  undefined1 local_138 [64];
  undefined1 local_f8 [64];
  undefined1 local_b8 [16];
  uchar *in_stack_ffffffffffffff58;
  uchar *in_stack_ffffffffffffff60;
  uchar *in_stack_ffffffffffffff68;
  uchar *in_stack_ffffffffffffff70;
  uchar *in_stack_ffffffffffffff78;
  uchar *in_stack_ffffffffffffff80;
  undefined1 local_78 [68];
  int local_34;
  BN_CTX *local_30;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  EC_POINT *local_10;
  EC_GROUP *local_8;
  
  local_34 = 0;
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  BN_CTX_start(in_R9);
  pBVar2 = BN_CTX_get(local_30);
  pBVar3 = BN_CTX_get(local_30);
  if (((((pBVar3 != (BIGNUM *)0x0) &&
        (iVar1 = EC_POINT_get_affine_coordinates(local_8,local_20,pBVar2,pBVar3,local_30),
        iVar1 != 0)) && (iVar1 = BN_bn2lebinpad(pBVar2,local_78,0x40), iVar1 == 0x40)) &&
      ((iVar1 = BN_bn2lebinpad(pBVar3,local_b8,0x40), iVar1 == 0x40 &&
       (iVar1 = BN_bn2lebinpad(local_18,local_f8,0x40), iVar1 == 0x40)))) &&
     (iVar1 = BN_bn2lebinpad(local_28,local_138,0x40), iVar1 == 0x40)) {
    point_mul_two(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                  in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    iVar1 = CRYPTO_memcmp("",local_78,0x40);
    if ((iVar1 == 0) && (iVar1 = CRYPTO_memcmp("",local_b8,0x40), iVar1 == 0)) {
      iVar1 = EC_POINT_set_to_infinity(local_8,local_10);
    }
    else {
      lVar4 = BN_lebin2bn(local_78,0x40,pBVar2);
      if ((lVar4 == 0) || (lVar4 = BN_lebin2bn(local_b8,0x40,pBVar3), lVar4 == 0))
      goto LAB_0014eb78;
      iVar1 = EC_POINT_set_affine_coordinates(local_8,local_10,pBVar2,pBVar3,local_30);
    }
    if (iVar1 != 0) {
      local_34 = 1;
    }
  }
LAB_0014eb78:
  BN_CTX_end(local_30);
  return local_34;
}

Assistant:

int
    point_mul_two_id_tc26_gost_3410_2012_512_paramSetA(
        const EC_GROUP *group, EC_POINT *r, const BIGNUM *n, const EC_POINT *q,
        const BIGNUM *m, BN_CTX *ctx) {
    int ret = 0;
    unsigned char b_x[64];
    unsigned char b_y[64];
    unsigned char b_n[64];
    unsigned char b_m[64];
    BIGNUM *x = NULL, *y = NULL;

    BN_CTX_start(ctx);
    x = BN_CTX_get(ctx);
    if ((y = BN_CTX_get(ctx)) == NULL
        /* pull out coords as bytes */
        || !EC_POINT_get_affine_coordinates(group, q, x, y, ctx) ||
        BN_bn2lebinpad(x, b_x, 64) != 64 || BN_bn2lebinpad(y, b_y, 64) != 64 ||
        BN_bn2lebinpad(n, b_n, 64) != 64 || BN_bn2lebinpad(m, b_m, 64) != 64)
        goto err;
    /* do the simultaneous scalar multiplication */
    point_mul_two(b_x, b_y, b_n, b_m, b_x, b_y);
    /* check for infinity */
    if (CRYPTO_memcmp(const_zb, b_x, 64) == 0 &&
        CRYPTO_memcmp(const_zb, b_y, 64) == 0) {
        if (!EC_POINT_set_to_infinity(group, r)) goto err;
    } else {
        /* otherwise, pack the bytes into the result */
        if (BN_lebin2bn(b_x, 64, x) == NULL ||
            BN_lebin2bn(b_y, 64, y) == NULL ||
            !EC_POINT_set_affine_coordinates(group, r, x, y, ctx))
            goto err;
    }
    ret = 1;
err:
    BN_CTX_end(ctx);
    return ret;
}